

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLightSource,_4UL>::Construct
                   (DB *db,LIST *params)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x98);
  puVar1[0x11] = 0;
  puVar1[0x12] = "IfcLightSource";
  puVar1[5] = 0;
  *puVar1 = 0x817628;
  puVar1[0x10] = 0x8176a0;
  puVar1[2] = 0x817650;
  puVar1[4] = 0x817678;
  puVar1[6] = puVar1 + 8;
  puVar1[7] = 0;
  *(undefined1 *)(puVar1 + 8) = 0;
  *(undefined1 *)(puVar1 + 10) = 0;
  puVar1[0xb] = 0;
  *(undefined1 *)(puVar1 + 0xd) = 0;
  *(undefined1 *)(puVar1 + 0xf) = 0;
  return (Object *)(puVar1 + 0x10);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }